

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O0

void __thiscall ServerService::receiveBroadcast(ServerService *this,int port,char *message)

{
  int iVar1;
  ostream *poVar2;
  ssize_t sVar3;
  size_t __n;
  char local_138 [4];
  int ret;
  char peerName [30];
  socklen_t local_10c;
  undefined1 local_108 [4];
  socklen_t peerAddrLen;
  char recvMsg [200];
  sockaddr_in peerAddr;
  sockaddr_in ownAddr;
  char *message_local;
  int port_local;
  ServerService *this_local;
  
  memset(local_108,0,200);
  local_10c = 0;
  memset(local_138,0,0x1e);
  memset(peerAddr.sin_zero,0,0x10);
  memset(recvMsg + 0xc0,0,0x10);
  peerAddr.sin_zero[0] = '\x02';
  peerAddr.sin_zero[1] = '\0';
  peerAddr.sin_zero._2_2_ = htons((uint16_t)port);
  peerAddr.sin_zero._4_4_ = htonl(0);
  iVar1 = socket(2,2,0);
  this->broadcastFD = iVar1;
  if (this->broadcastFD == -1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Create Broadcast Sock Fail");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    iVar1 = bind(this->broadcastFD,(sockaddr *)peerAddr.sin_zero,0x10);
    if (iVar1 == -1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Bind Broadcast Address Fail");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      do {
        while (sVar3 = recvfrom(this->broadcastFD,local_108,200,0,(sockaddr *)(recvMsg + 0xc0),
                                &local_10c), (int)sVar3 < 1) {
          poVar2 = std::operator<<((ostream *)&std::cout,"Receive Broadcast Message Error");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
        inet_ntop(2,recvMsg + 0xc4,local_138,0x1e);
        iVar1 = strcmp("0.0.0.0",local_138);
      } while (iVar1 == 0);
      printf("Receive from %s, msg:%s\n",local_138,local_108);
      __n = strlen(local_138);
      memcpy(message,local_138,__n);
      memset(local_108,0,200);
    }
  }
  return;
}

Assistant:

void ServerService::receiveBroadcast(int port, char* message) {
    struct sockaddr_in ownAddr, peerAddr;
    char recvMsg[200] = {0};
    socklen_t peerAddrLen = 0;
    char peerName[30] = {0};
    int ret = 0;

    bzero(&ownAddr, sizeof(struct sockaddr_in));
    bzero(&peerAddr, sizeof(struct sockaddr_in));
    ownAddr.sin_family = AF_INET;
    ownAddr.sin_port = htons(port);
    ownAddr.sin_addr.s_addr = htonl(INADDR_ANY);

    broadcastFD = socket(AF_INET, SOCK_DGRAM, 0);
    if (broadcastFD == -1) {
        cout << "Create Broadcast Sock Fail" << endl;
        return;
    }

    ret = bind(broadcastFD, (struct sockaddr *) &ownAddr, sizeof(struct sockaddr_in));
    if (ret == -1) {
        cout << "Bind Broadcast Address Fail" << endl;
        return;
    }

    while (true) {
        ret = recvfrom(broadcastFD, recvMsg, sizeof(recvMsg), 0, (struct sockaddr *) &peerAddr, &peerAddrLen);
        if (ret > 0) {
            inet_ntop(AF_INET, &peerAddr.sin_addr.s_addr, peerName, sizeof(peerName));
            if (!strcmp("0.0.0.0", peerName)) {
                continue;
            } else {
                printf("Receive from %s, msg:%s\n", peerName, recvMsg);
                memcpy(message, peerName, strlen(peerName));
                break;
            }
        } else {
            cout << "Receive Broadcast Message Error" << endl;
        }
    }
    bzero(recvMsg, sizeof(recvMsg));
}